

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

void __thiscall MIDIplay::describeChannels(MIDIplay *this,char *str,char *attr,size_t size)

{
  uint uVar1;
  bool bVar2;
  OPL3 *pOVar3;
  reference pAVar4;
  reference puVar5;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar6;
  byte local_51;
  const_iterator cStack_50;
  uint8_t attribute;
  const_users_iterator locnext;
  const_users_iterator loc;
  AdlChannel *adlChannel;
  uint32_t index;
  uint32_t numChannels;
  Synth *synth;
  size_t size_local;
  char *attr_local;
  char *str_local;
  MIDIplay *this_local;
  
  if ((str != (char *)0x0) && (size != 0)) {
    pOVar3 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator*(&this->m_synth);
    uVar1 = pOVar3->m_numChannels;
    for (adlChannel._0_4_ = 0; (uint)adlChannel < uVar1 && (ulong)(uint)adlChannel < size - 1;
        adlChannel._0_4_ = (uint)adlChannel + 1) {
      pAVar4 = std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::operator[]
                         (&this->m_chipChannels,(ulong)(uint)adlChannel);
      cStack_50 = pl_list<MIDIplay::AdlChannel::LocationData>::begin(&pAVar4->users);
      locnext.cell_ = cStack_50.cell_;
      bVar2 = pl_iterator<const_pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end(&locnext);
      if (!bVar2) {
        pl_iterator<const_pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator++
                  (&stack0xffffffffffffffb0);
      }
      bVar2 = pl_iterator<const_pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end(&locnext);
      if (bVar2) {
        str[(uint)adlChannel] = '-';
      }
      else {
        bVar2 = pl_iterator<const_pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end
                          (&stack0xffffffffffffffb0);
        if (bVar2) {
          puVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&pOVar3->m_channelCategory,(ulong)(uint)adlChannel);
          if (*puVar5 == 0) {
            str[(uint)adlChannel] = '+';
          }
          else if (*puVar5 - 1 < 2) {
            str[(uint)adlChannel] = '#';
          }
          else {
            str[(uint)adlChannel] = 'r';
          }
        }
        else {
          str[(uint)adlChannel] = '@';
        }
      }
      local_51 = 0;
      bVar2 = pl_iterator<const_pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end(&locnext);
      if (!bVar2) {
        ppVar6 = pl_iterator<const_pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator->
                           (&locnext);
        local_51 = (byte)(ppVar6->value).loc.MidCh & 0xf;
      }
      attr[(uint)adlChannel] = local_51;
    }
    str[(uint)adlChannel] = '\0';
    attr[(uint)adlChannel] = '\0';
  }
  return;
}

Assistant:

void MIDIplay::describeChannels(char *str, char *attr, size_t size)
{
    if (!str || size <= 0)
        return;

    Synth &synth = *m_synth;
    uint32_t numChannels = synth.m_numChannels;

    uint32_t index = 0;

    while(index < numChannels && index < size - 1)
    {
        const AdlChannel &adlChannel = m_chipChannels[index];

        AdlChannel::const_users_iterator loc = adlChannel.users.begin();
        AdlChannel::const_users_iterator locnext(loc);

        if(!loc.is_end())
            ++locnext;

        if(loc.is_end())  // off
            str[index] = '-';
        else if(!locnext.is_end())  // arpeggio
            str[index] = '@';
        else  // on
        {
            switch(synth.m_channelCategory[index])
            {
            case Synth::ChanCat_Regular:
                str[index] = '+';
                break;
            case Synth::ChanCat_4op_First:
            case Synth::ChanCat_4op_Second:
                str[index] = '#';
                break;
            default:  // rhythm-mode percussion
                str[index] = 'r';
                break;
            }
        }

        uint8_t attribute = 0;
        if(!loc.is_end())  // 4-bit color index of MIDI channel
            attribute |= (uint8_t)(loc->value.loc.MidCh & 0xF);

        attr[index] = (char)attribute;
        ++index;
    }

    str[index] = 0;
    attr[index] = 0;
}